

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave_header.cpp
# Opt level: O2

WaveHeader * cinemo::wh::parseWaveHeader(string *file)

{
  bool bVar1;
  WaveHeader *this;
  long lVar2;
  long lVar3;
  header_pos hVar4;
  header_pos hVar5;
  header_pos hVar6;
  header_pos hVar7;
  ulong uVar8;
  size_t size;
  size_t sStack_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  ifstream f;
  int aiStack_320 [122];
  char buff [256];
  
  std::ifstream::ifstream(&f,(string *)file,_S_in|_S_bin|_S_ate);
  this = (WaveHeader *)operator_new(0xa8);
  WaveHeader::WaveHeader(this);
  if (*(int *)((long)aiStack_320 + *(long *)(_f + -0x18)) == 0) {
    lVar2 = std::istream::tellg();
    std::__cxx11::string::_M_assign((string *)this);
    this->FileSize = (uint32_t)lVar2;
    if (lVar2 < 0x2c) {
      std::ifstream::close();
      std::bitset<8UL>::set(&this->ErrorFlags,1,true);
    }
    else {
      std::ios::clear((int)&f + (int)*(undefined8 *)(_f + -0x18));
      std::istream::seekg((long)&f,_S_beg);
      std::istream::read((char *)&f,(long)buff);
      local_360.field_2._M_local_buf[0] = buff[0];
      local_360.field_2._M_local_buf[1] = buff[1];
      local_360.field_2._M_local_buf[2] = buff[2];
      local_360.field_2._M_local_buf[3] = buff[3];
      local_360._M_string_length = 4;
      local_360.field_2._M_local_buf[4] = '\0';
      local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
      bVar1 = std::operator!=(&local_360,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              WaveRIFFString_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_360);
      if (bVar1) {
        std::ifstream::close();
        sStack_370 = 2;
      }
      else {
        std::istream::read((char *)&f,(long)&this->RiffSize);
        if (this->FileSize - this->RiffSize != 8) {
          std::bitset<8UL>::set(&this->WarningFlags,0,true);
        }
        std::istream::read((char *)&f,(long)buff);
        local_360.field_2._M_local_buf[0] = buff[0];
        local_360.field_2._M_local_buf[1] = buff[1];
        local_360.field_2._M_local_buf[2] = buff[2];
        local_360.field_2._M_local_buf[3] = buff[3];
        local_360._M_string_length = 4;
        local_360.field_2._M_local_buf[4] = '\0';
        local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
        std::__cxx11::string::operator=((string *)&this->WaveId,(string *)&local_360);
        std::__cxx11::string::~string((string *)&local_360);
        bVar1 = std::operator!=(&this->WaveId,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )WaveWaveIdString_abi_cxx11_);
        if (!bVar1) {
          lVar2 = std::istream::tellg();
          std::istream::read((char *)&f,(long)buff);
          lVar3 = std::istream::tellg();
          size = lVar3 - lVar2;
          hVar4 = searchForHeader(buff,size,(string *)WaveFormatString_abi_cxx11_);
          hVar5 = searchForHeader(buff,size,(string *)WaveFactString_abi_cxx11_);
          hVar6 = searchForHeader(buff,size,(string *)WaveDataString_abi_cxx11_);
          hVar7 = searchForHeader(buff,size,(string *)WaveListString_abi_cxx11_);
          if (((ulong)hVar4 & 1) == 0) {
            std::bitset<8UL>::set(&this->ErrorFlags,4,true);
          }
          if (((ulong)hVar6 & 1) == 0) {
            std::bitset<8UL>::set(&this->ErrorFlags,5,true);
          }
          if ((this->ErrorFlags).super__Base_bitset<1UL>._M_w == 0) {
            uVar8 = (ulong)hVar5 >> 0x20;
            lVar2 = lVar2 + 4;
            if ((((ulong)hVar5 & 1) != 0) || (((ulong)hVar7 & 1) != 0)) {
              std::bitset<8UL>::set(&this->WarningFlags,1,true);
              if (((ulong)hVar5 & 1) != 0) {
                uVar8 = (ulong)(uint)(hVar5.second + (int)lVar2);
                this->HasFact = true;
              }
            }
            if (((ulong)hVar4 & 1) != 0) {
              getFmtFromFileHandle
                        (this,&f,(header_pos)
                                 ((ulong)hVar4 & 0xff |
                                 (long)hVar4 + (lVar2 << 0x20) & 0xffffffff00000000U));
            }
            if (((ulong)hVar5 & 1) != 0) {
              getFactFromFileHandle(this,&f,(header_pos)((ulong)hVar5 & 0xff | uVar8 << 0x20));
            }
            if (((ulong)hVar6 & 1) != 0) {
              getDataFromFileHandle
                        (this,&f,(header_pos)
                                 ((ulong)hVar6 & 0xff |
                                 (long)hVar6 + (lVar2 << 0x20) & 0xffffffff00000000U));
            }
            if (((ulong)hVar7 & 1) != 0) {
              this->hasList = true;
            }
          }
          std::ifstream::close();
          goto LAB_00106082;
        }
        sStack_370 = 3;
      }
      std::bitset<8UL>::set(&this->ErrorFlags,sStack_370,true);
    }
  }
  else {
    std::bitset<8UL>::set(&this->ErrorFlags,0,true);
  }
LAB_00106082:
  std::ifstream::~ifstream(&f);
  return this;
}

Assistant:

WaveHeader* parseWaveHeader(const string& file) {

            std::ifstream f(file, std::ios::in | std::ios::binary |
                                  std::ios::ate);

            WaveHeader* const wh = new WaveHeader;

            if (!f || !f.good()) {
                wh->ErrorFlags.set(static_cast<int>(ERROR_FileIo), 1);
                return wh;
            }

            //Check for file size requirements
            long fSize = f.tellg(); //file is opened at the end
            wh->File = file;
            wh->FileSize = static_cast<uint32_t>(fSize);

            if (fSize < WaveMinLength) {
                f.close();
                wh->ErrorFlags.set(static_cast<int>(ERROR_FileTooSmall), 1);
                return wh; //because there is no point in reading rest of the file
            }

            //reset file handle (rewind)
            f.clear();
            f.seekg(0, std::ios::beg);

            char buff[WaveBufferSize]; //buffer for read operations

            //Check if file is RIFF
            f.read(&buff[0], 4); //get first 4 bytes
            if (string(&buff[0], 4) != WaveRIFFString) { //not valid
                f.close();
                wh->ErrorFlags.set(static_cast<int>(ERROR_NoRiffChunk), 1);
                return wh; //because there is no point in reading rest of the file
            }

            //RIFF Size (which should be (total file size - 8)
            //otherwise file might be corrupt
            f.read(reinterpret_cast<char*>(&wh->RiffSize), 4);
            if (wh->FileSize - wh->RiffSize != 8) {
                wh->WarningFlags.set(WARNING_SizeMismatch, 1); //just a warning
            }

            //extract "WAVE"
            f.read(&buff[0], 4);
            wh->WaveId = string(&buff[0], 4);
            if (wh->WaveId != WaveWaveIdString) {
                wh->ErrorFlags.set(static_cast<int>(ERROR_NoWaveChunk), 1);
                return wh; //because there is no point in reading rest of the file
            }

            //next might be "fmt " but there is no guarantee!
            long posBeforeHeaderSearch = static_cast<long>(f.tellg());
            header_pos fmt, fact, data, List;
            f.read(&buff[0], WaveBufferSize);
            size_t read = static_cast<size_t>(static_cast<long>(f.tellg()) -
                                              posBeforeHeaderSearch);
            //for fmt and fact there is no guranatee which comes first
            //so the search function is called twice
            fmt = searchForHeader(buff, read, WaveFormatString);
            fact = searchForHeader(buff, read, WaveFactString);
            //TODO search for data within fmt or fact search to speed up!
            data = searchForHeader(buff, read, WaveDataString);
            List = searchForHeader(buff, read, WaveListString);

            //fmt and data SHOULD be available, otherwise file is corrupted
            //fact is optional
            if (!fmt.first) {
                wh->ErrorFlags.set(static_cast<int>(ERROR_NoFmtChunk), 1);
            }

            if (!data.first) {
                wh->ErrorFlags.set(static_cast<int>(ERROR_NoDataChunk), 1);
            }

            if (wh->ErrorFlags.any()) {
                f.close();
                return wh; //to much errors! no point in reading rest of the file
            }

            posBeforeHeaderSearch += 4; //since all headers are 4 byte

            if (fact.first || List.first) {
                wh->WarningFlags.set(
                        static_cast<int>(WARNING_NoneStandardExtension), 1);
            }

            if (fact.first) {
                fact.second += posBeforeHeaderSearch;
                wh->HasFact = true; //set the flag
                //fact should be parsed after fmt
            }

            if (fmt.first) {
                fmt.second += posBeforeHeaderSearch;
                getFmtFromFileHandle(wh, f, fmt);
            }

            if (fact.first) {
                getFactFromFileHandle(wh, f, fact);
            }

            if (data.first) {
                data.second += posBeforeHeaderSearch;
                getDataFromFileHandle(wh, f, data);
            }

            if (List.first) {
                wh->hasList = true;
                getListInfoFromFileHandle(wh, f, List);
            }

            f.close();
            return wh;
        }